

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriter.cpp
# Opt level: O0

uint64_t __thiscall MILBlob::Blob::FileWriter::GetNextAlignedOffset(FileWriter *this)

{
  undefined1 auVar1 [16];
  uint64_t pad;
  undefined8 local_28;
  uint64_t offset;
  FileWriter *this_local;
  
  offset = (uint64_t)this;
  std::istream::seekg((long)this,_S_beg);
  auVar1 = std::istream::tellg();
  local_28 = auVar1._8_8_;
  pad = auVar1._0_8_;
  this_local = (FileWriter *)std::fpos::operator_cast_to_long((fpos *)&pad);
  if (((ulong)this_local & 0x3f) != 0) {
    this_local = (FileWriter *)((long)this_local + (0x40 - ((ulong)this_local & 0x3f)));
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t FileWriter::GetNextAlignedOffset()
{
    m_fileStream.seekg(0, std::ios::end);
    uint64_t offset = static_cast<uint64_t>(m_fileStream.tellg());
    if (offset % DefaultStorageAlignment == 0) {
        return offset;
    }
    auto pad = DefaultStorageAlignment - (offset % DefaultStorageAlignment);
    return offset + pad;
}